

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O3

char * __thiscall SMBusAnalyzerSettings::SaveSettings(SMBusAnalyzerSettings *this)

{
  bool bVar1;
  char *pcVar2;
  SimpleArchive text_archive;
  SimpleArchive aSStack_18 [8];
  
  SimpleArchive::SimpleArchive(aSStack_18);
  SimpleArchive::operator<<(aSStack_18,&this->mSMBDAT);
  SimpleArchive::operator<<(aSStack_18,&this->mSMBCLK);
  SimpleArchive::operator<<(aSStack_18,this->mDecodeLevel);
  bVar1 = (bool)AnalyzerSettingInterfaceBool::GetValue();
  SimpleArchive::operator<<(aSStack_18,bVar1);
  SimpleArchive::GetString();
  pcVar2 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_18);
  return pcVar2;
}

Assistant:

const char* SMBusAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mSMBDAT;
    text_archive << mSMBCLK;
    text_archive << mDecodeLevel;
    text_archive << mCalculatePECInterface.GetValue();

    return SetReturnString( text_archive.GetString() );
}